

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O0

int array_rangeop_getrange
              (t_array_rangeop *x,char **firstitemp,int *nitemp,int *stridep,int *arrayonsetp)

{
  int iVar1;
  t_template *x_00;
  t_template *template;
  t_symbol *arraytype;
  int local_58;
  int type;
  int nitem;
  int arrayonset;
  int fieldonset;
  int stride;
  _array *a;
  _glist *glist;
  int *arrayonsetp_local;
  int *stridep_local;
  int *nitemp_local;
  char **firstitemp_local;
  t_array_rangeop *x_local;
  
  glist = (_glist *)arrayonsetp;
  arrayonsetp_local = stridep;
  stridep_local = nitemp;
  nitemp_local = (int *)firstitemp;
  firstitemp_local = (char **)x;
  _fieldonset = array_client_getbuf(&x->x_tc,(_glist **)&a);
  if (_fieldonset == (_array *)0x0) {
    x_local._4_4_ = 0;
  }
  else {
    x_00 = template_findbyname(_fieldonset->a_templatesym);
    iVar1 = template_find_field(x_00,(t_symbol *)firstitemp_local[0xe],&nitem,
                                (int *)((long)&arraytype + 4),(t_symbol **)&template);
    if ((iVar1 == 0) || (arraytype._4_4_ != 0)) {
      pd_error(firstitemp_local,"can\'t find field %s in struct %s",
               *(undefined8 *)firstitemp_local[0xe],_fieldonset->a_templatesym->s_name);
      x_local._4_4_ = 0;
    }
    else {
      iVar1 = _fieldonset->a_elemsize;
      type = (int)*(float *)(firstitemp_local + 0xd);
      if (type < 0) {
        type = 0;
      }
      else if (_fieldonset->a_n < type) {
        type = _fieldonset->a_n;
      }
      if (0.0 < *(float *)((long)firstitemp_local + 0x6c) ||
          *(float *)((long)firstitemp_local + 0x6c) == 0.0) {
        local_58 = (int)*(float *)((long)firstitemp_local + 0x6c);
        if (_fieldonset->a_n < local_58 + type) {
          local_58 = _fieldonset->a_n - type;
        }
      }
      else {
        local_58 = _fieldonset->a_n - type;
      }
      *(char **)nitemp_local = _fieldonset->a_vec + (nitem + type * iVar1);
      *stridep_local = local_58;
      *arrayonsetp_local = iVar1;
      *(int *)&(glist->gl_obj).te_g.g_pd = type;
      x_local._4_4_ = 1;
    }
  }
  return x_local._4_4_;
}

Assistant:

static int array_rangeop_getrange(t_array_rangeop *x,
    char **firstitemp, int *nitemp, int *stridep, int *arrayonsetp)
{
    t_glist *glist;
    t_array *a = array_client_getbuf(&x->x_tc, &glist);
    int stride, fieldonset, arrayonset, nitem, type;
    t_symbol *arraytype;
    t_template *template;
    if (!a)
        return (0);
    template = template_findbyname(a->a_templatesym);
    if (!template_find_field(template, x->x_elemfield, &fieldonset,
        &type, &arraytype) || type != DT_FLOAT)
    {
        pd_error(x, "can't find field %s in struct %s",
            x->x_elemfield->s_name, a->a_templatesym->s_name);
        return (0);
    }
    stride = a->a_elemsize;
    arrayonset = x->x_onset;
    if (arrayonset < 0)
        arrayonset = 0;
    else if (arrayonset > a->a_n)
        arrayonset = a->a_n;
    if (x->x_n < 0)
        nitem = a->a_n - arrayonset;
    else
    {
        nitem = x->x_n;
        if (nitem + arrayonset > a->a_n)
            nitem = a->a_n - arrayonset;
    }
    *firstitemp = a->a_vec+(fieldonset+arrayonset*stride);
    *nitemp = nitem;
    *stridep = stride;
    *arrayonsetp = arrayonset;
    return (1);
}